

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_list.hpp
# Opt level: O0

torrent * __thiscall
libtorrent::aux::torrent_list<libtorrent::aux::torrent>::find_obfuscated
          (torrent_list<libtorrent::aux::torrent> *this,sha1_hash *ih)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_true>
  local_28;
  iterator i;
  sha1_hash *ih_local;
  torrent_list<libtorrent::aux::torrent> *this_local;
  
  i.
  super__Node_iterator_base<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_true>
             )(_Node_iterator_base<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_true>
               )ih;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_map<libtorrent::digest32<160L>,_libtorrent::aux::torrent_*,_std::hash<libtorrent::digest32<160L>_>,_std::equal_to<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>_>
       ::find(&this->m_obfuscated_index,ih);
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<libtorrent::digest32<160L>,_libtorrent::aux::torrent_*,_std::hash<libtorrent::digest32<160L>_>,_std::equal_to<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>_>
       ::end(&this->m_obfuscated_index);
  bVar1 = ::std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (torrent_list<libtorrent::aux::torrent> *)0x0;
  }
  else {
    ppVar2 = ::std::__detail::
             _Node_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_false,_true>
                           *)&local_28);
    this_local = (torrent_list<libtorrent::aux::torrent> *)ppVar2->second;
  }
  return (torrent *)this_local;
}

Assistant:

T* find_obfuscated(sha1_hash const& ih)
	{
		auto const i = m_obfuscated_index.find(ih);
		if (i == m_obfuscated_index.end()) return nullptr;
		return i->second;
	}